

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_global_segment_info(global_segment sec)

{
  global_pointer pgVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  uint local_24;
  int i;
  global_pointer global_segment_addr;
  global_segment sec_local;
  
  for (local_24 = 0; local_24 < sec.global_segment_count; local_24 = local_24 + 1) {
    pgVar1 = sec.global_segment_addr + (int)local_24;
    pcVar3 = val_type((pgVar1->type).val_type);
    bVar2 = (pgVar1->type).mut_type;
    pcVar4 = val_type((pgVar1->type).val_type);
    printf("  - global[%d]: %s mutable=%d - init %s=",(ulong)local_24,pcVar3,(ulong)bVar2,pcVar4);
    switch((pgVar1->type).val_type) {
    case '|':
      printf("%f\n",*(pgVar1->init_data).arg);
      break;
    case '}':
      printf("%f\n",(double)*(pgVar1->init_data).arg);
      break;
    case '~':
      printf("%ld\n",*(pgVar1->init_data).arg);
      break;
    case '\x7f':
      printf("%d\n",(ulong)*(pgVar1->init_data).arg);
      break;
    default:
      fprintf(_stderr,"\nwrong typeID\n");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/cmd/wcasm-objdump/print.c"
                    ,0xd7,"void print_global_segment_info(global_segment)");
    }
  }
  return;
}

Assistant:

void print_global_segment_info(global_segment sec) {
    global_pointer global_segment_addr;
    for (int i = 0; i < sec.global_segment_count; ++i) {
        global_segment_addr = sec.global_segment_addr + i;
        printf("  - global[%d]: %s mutable=%d - init %s=", i, val_type(global_segment_addr->type.val_type),
               global_segment_addr->type.mut_type, val_type(global_segment_addr->type.val_type));
        switch (global_segment_addr->type.val_type) {
            case I32:
                printf("%d\n", *(int32 *) global_segment_addr->init_data.arg);
                break;
            case I64:
                printf("%ld\n", *(int64 *) global_segment_addr->init_data.arg);
                break;
            case F32:
                printf("%f\n", *(float32 *) global_segment_addr->init_data.arg);
                break;
            case F64:
                printf("%f\n", *(float64 *) global_segment_addr->init_data.arg);
                break;
            default:
                errorExit("\nwrong typeID\n");
        }
    }
}